

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

LOs __thiscall
Omega_h::ents_on_closure
          (Omega_h *this,Mesh *mesh,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *class_names,Int ent_dim)

{
  void *extraout_RDX;
  LOs LVar1;
  Read<signed_char> ents_are_on;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> class_pairs;
  Write<signed_char> WStack_58;
  Write<signed_char> local_48;
  _Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> local_38;
  
  to_class_pairs((vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)&local_38,mesh,
                 class_names);
  mark_class_closures((Omega_h *)&local_48,mesh,ent_dim,
                      (vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)&local_38);
  Write<signed_char>::Write(&WStack_58,&local_48);
  collect_marked(this,(Read<signed_char> *)&WStack_58);
  Write<signed_char>::~Write(&WStack_58);
  Write<signed_char>::~Write(&local_48);
  std::_Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::~_Vector_base
            (&local_38);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs ents_on_closure(
    Mesh* mesh, std::set<std::string> const& class_names, Int ent_dim) {
  auto class_pairs = to_class_pairs(mesh, class_names);
  auto ents_are_on = mark_class_closures(mesh, ent_dim, class_pairs);
  return collect_marked(ents_are_on);
}